

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O3

bool __thiscall std::less<Node>::operator()(less<Node> *this,Node *__x,Node *__y)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar2 = *(float *)&__x->p;
  fVar3 = *(float *)this;
  if (fVar3 <= fVar2) {
    lVar1 = 1;
    fVar4 = fVar3;
    fVar5 = fVar2;
    do {
      if (((fVar5 != fVar4) || (NAN(fVar5) || NAN(fVar4))) || (lVar1 == 6)) {
        if (fVar2 <= fVar3) {
          lVar1 = 1;
          do {
            if (((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) || (lVar1 == 6)) {
              return *(uint *)&__x[1].pEnd < *(uint *)(this + 0x18);
            }
            fVar3 = *(float *)(this + lVar1 * 4);
            fVar2 = *(float *)((long)&__x->p + lVar1 * 4);
            lVar1 = lVar1 + 1;
          } while (fVar2 <= fVar3);
        }
        return false;
      }
      fVar5 = *(float *)((long)&__x->p + lVar1 * 4);
      fVar4 = *(float *)(this + lVar1 * 4);
      lVar1 = lVar1 + 1;
    } while (fVar4 <= fVar5);
  }
  return true;
}

Assistant:

inline bool operator<(const vec& rhs) const {
    for (uint i = 0; i < N; i++) {
      if (m_s[i] < rhs.m_s[i])
        return true;
      else if (!(m_s[i] == rhs.m_s[i]))
        return false;
    }

    return false;
  }